

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleMi<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *this_01;
  TriangleMesh *pTVar8;
  BuildPrim *pBVar9;
  long lVar10;
  char *pcVar11;
  undefined8 uVar12;
  ulong uVar13;
  longlong *plVar14;
  size_t sVar15;
  ulong uVar16;
  size_t i;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar21;
  undefined1 auVar22 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vuint4 v0;
  vuint4 vgeomID;
  vuint4 v1;
  vuint4 v2;
  vuint4 vprimID;
  
  uVar2 = current->_begin;
  uVar3 = current->_end;
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  vgeomID.field_0.v[0] = 0x50;
  this_01 = pTVar7->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    v1.field_0.v[1]._0_1_ = 1;
    v1.field_0.v[0] = (longlong)this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    v2.field_0.v[0] = (longlong)this_01;
    v0.field_0.v[1]._0_1_ = 1;
    v0.field_0.v[0] = (longlong)&FastAllocator::s_thread_local_allocators_lock;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  uVar12 = vgeomID.field_0.v[0];
  uVar17 = (ulong)(uVar3 - uVar2);
  pTVar7->bytesUsed = pTVar7->bytesUsed + vgeomID.field_0.v[0];
  sVar15 = pTVar7->cur;
  uVar16 = (ulong)(-(int)sVar15 & 0xf);
  uVar13 = sVar15 + vgeomID.field_0.v[0] + uVar16;
  pTVar7->cur = uVar13;
  if (pTVar7->end < uVar13) {
    pTVar7->cur = sVar15;
    uVar13 = pTVar7->allocBlockSize;
    if ((ulong)(vgeomID.field_0.v[0] * 4) < uVar13 || vgeomID.field_0.v[0] * 4 - uVar13 == 0) {
      v0.field_0.v[0] = uVar13;
      plVar14 = (longlong *)FastAllocator::malloc(this_00,(size_t)&v0);
      pTVar7->ptr = (char *)plVar14;
      sVar15 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar15;
      pTVar7->end = v0.field_0.v[0];
      pTVar7->cur = uVar12;
      if ((ulong)v0.field_0.v[0] < (ulong)uVar12) {
        pTVar7->cur = 0;
        v0.field_0.v[0] = pTVar7->allocBlockSize;
        plVar14 = (longlong *)FastAllocator::malloc(this_00,(size_t)&v0);
        pTVar7->ptr = (char *)plVar14;
        sVar15 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar15;
        pTVar7->end = v0.field_0.v[0];
        pTVar7->cur = uVar12;
        if ((ulong)v0.field_0.v[0] < (ulong)uVar12) {
          pTVar7->cur = 0;
          plVar14 = (longlong *)0x0;
          goto LAB_00458fc9;
        }
      }
      pTVar7->bytesWasted = sVar15;
    }
    else {
      plVar14 = (longlong *)FastAllocator::malloc(this_00,(size_t)&vgeomID);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar16;
    plVar14 = (longlong *)(pTVar7->ptr + (uVar13 - vgeomID.field_0._0_8_));
  }
LAB_00458fc9:
  v0.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
  v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
  v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
  vgeomID.field_0.v[0] = -1;
  vgeomID.field_0.i[2] = 0xffffffff;
  vgeomID.field_0.i[3] = 0xffffffff;
  vprimID.field_0.i[0] = 0xffffffff;
  vprimID.field_0.i[1] = 0xffffffff;
  vprimID.field_0.i[2] = 0xffffffff;
  vprimID.field_0.i[3] = 0xffffffff;
  pTVar8 = this->mesh;
  pBVar9 = this->morton;
  uVar3 = this->geomID_;
  aVar21 = _DAT_01f45a40;
  auVar22 = _DAT_01f45a30;
  for (lVar18 = 0; uVar17 * 4 - lVar18 != 0; lVar18 = lVar18 + 4) {
    uVar19 = *(uint *)((long)&pBVar9[uVar2].field_0 + lVar18 * 2 + 4);
    lVar20 = (ulong)uVar19 * *(long *)&pTVar8->field_0x68;
    lVar10 = *(long *)&(pTVar8->super_Geometry).field_0x58;
    pcVar11 = (pTVar8->vertices0).super_RawBufferView.ptr_ofs;
    uVar4 = *(uint *)(lVar10 + lVar20);
    uVar5 = *(uint *)(lVar10 + 4 + lVar20);
    uVar13 = (pTVar8->vertices0).super_RawBufferView.stride;
    uVar6 = *(uint *)(lVar10 + 8 + lVar20);
    auVar22 = minps(auVar22,*(undefined1 (*) [16])(pcVar11 + uVar4 * uVar13));
    auVar25 = minps(*(undefined1 (*) [16])(pcVar11 + uVar5 * uVar13),
                    *(undefined1 (*) [16])(pcVar11 + uVar6 * uVar13));
    auVar22 = minps(auVar22,auVar25);
    auVar25 = maxps((undefined1  [16])aVar21,*(undefined1 (*) [16])(pcVar11 + uVar4 * uVar13));
    auVar24 = maxps(*(undefined1 (*) [16])(pcVar11 + uVar5 * uVar13),
                    *(undefined1 (*) [16])(pcVar11 + uVar6 * uVar13));
    aVar21 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar25,auVar24);
    *(uint *)((long)&vgeomID.field_0 + lVar18) = uVar3;
    *(uint *)((long)&vprimID.field_0 + lVar18) = uVar19;
    uVar19 = (uint)(uVar13 >> 2) & 0x3fffffff;
    *(uint *)((long)&v0.field_0 + lVar18) = uVar19 * uVar4;
    *(uint *)((long)&v1.field_0 + lVar18) = uVar5 * uVar19;
    *(uint *)((long)&v2.field_0 + lVar18) = uVar19 * uVar6;
  }
  for (; uVar17 < 4; uVar17 = uVar17 + 1) {
    vprimID.field_0.i[uVar17] = 0xffffffff;
    v0.field_0.i[uVar17] = 0;
    vgeomID.field_0.i[uVar17] = vgeomID.field_0.i[0];
    v1.field_0.i[uVar17] = 0;
    v2.field_0.i[uVar17] = 0;
  }
  *plVar14 = v0.field_0.v[0];
  plVar14[1] = v0.field_0.v[1];
  plVar14[2] = v1.field_0.v[0];
  plVar14[3] = v1.field_0.v[1];
  plVar14[4] = v2.field_0.v[0];
  plVar14[5] = v2.field_0.v[1];
  plVar14[6] = vgeomID.field_0.v[0];
  plVar14[7] = CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
  plVar14[8] = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
  plVar14[9] = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
  aVar23._0_12_ = auVar22._0_12_;
  aVar23.m128[3] = (float)(current->_end - current->_begin);
  (__return_storage_ptr__->ref).ptr = (ulong)plVar14 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar23;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar21;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4i* accel = (Triangle4i*) alloc.malloc1(sizeof(Triangle4i),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);
        
        vuint4 v0 = zero, v1 = zero, v2 = zero;
        vuint4 vgeomID = -1, vprimID = -1;
        const TriangleMesh* __restrict__ const mesh = this->mesh;
        
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID[i] = geomID_;
          vprimID[i] = primID;
          unsigned int int_stride = mesh->vertices0.getStride()/4;
          v0[i] = tri.v[0] * int_stride; 
          v1[i] = tri.v[1] * int_stride;
          v2[i] = tri.v[2] * int_stride;
        }
        
        for (size_t i=items; i<4; i++)
        {
          vgeomID[i] = vgeomID[0];
          vprimID[i] = -1;
          v0[i] = 0;
          v1[i] = 0; 
          v2[i] = 0;
        }
        Triangle4i::store_nt(accel,Triangle4i(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }